

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.c
# Opt level: O1

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,size_t X_limbs,uchar *input,size_t input_length)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong *puVar4;
  ulong *puVar5;
  int iVar6;
  
  iVar6 = -8;
  if (((input_length >> 3) + 1) - (ulong)((input_length & 7) == 0) <= X_limbs) {
    if (X_limbs == 0) {
      iVar6 = 0;
    }
    else {
      memset(X,0,X_limbs * 8);
      if (input_length != 0) {
        memcpy((void *)((X_limbs * 8 - input_length) + (long)X),input,input_length);
      }
      puVar4 = X + (X_limbs - 1);
      iVar6 = 0;
      if (X <= puVar4) {
        puVar5 = X + 1;
        do {
          uVar1 = puVar5[-1];
          uVar2 = *puVar4;
          puVar5[-1] = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                       (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                       (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
          *puVar4 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                    (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                    (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                    (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          puVar4 = puVar4 + -1;
          bVar3 = puVar5 <= puVar4;
          puVar5 = puVar5 + 1;
          iVar6 = 0;
        } while (bVar3);
      }
    }
  }
  return iVar6;
}

Assistant:

int mbedtls_mpi_core_read_be(mbedtls_mpi_uint *X,
                             size_t X_limbs,
                             const unsigned char *input,
                             size_t input_length)
{
    const size_t limbs = CHARS_TO_LIMBS(input_length);

    if (X_limbs < limbs) {
        return MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL;
    }

    /* If X_limbs is 0, input_length must also be 0 (from previous test).
     * Nothing to do. */
    if (X_limbs == 0) {
        return 0;
    }

    memset(X, 0, X_limbs * ciL);

    /* memcpy() with (NULL, 0) is undefined behaviour */
    if (input_length != 0) {
        size_t overhead = (X_limbs * ciL) - input_length;
        unsigned char *Xp = (unsigned char *) X;
        memcpy(Xp + overhead, input, input_length);
    }

    mbedtls_mpi_core_bigendian_to_host(X, X_limbs);

    return 0;
}